

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_31b31b::Handlers::endUnderlay(Handlers *this)

{
  element_type *this_00;
  shared_ptr<QPDFJob::UOConfig> local_20;
  Handlers *local_10;
  Handlers *this_local;
  
  local_10 = this;
  this_00 = std::__shared_ptr_access<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->c_uo);
  QPDFJob::UOConfig::endUnderlayOverlay(this_00);
  std::shared_ptr<QPDFJob::UOConfig>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<QPDFJob::UOConfig>::operator=(&this->c_uo,&local_20);
  std::shared_ptr<QPDFJob::UOConfig>::~shared_ptr(&local_20);
  return;
}

Assistant:

void
Handlers::endUnderlay()
{
    c_uo->endUnderlayOverlay();
    c_uo = nullptr;
}